

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O2

ssize_t __thiscall Http2::FrameWriter::write(FrameWriter *this,int __fd,void *__buf,size_t __n)

{
  const_reference pvVar1;
  long lVar2;
  undefined4 in_register_00000034;
  
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,0);
  lVar2 = QIODevice::write((char *)CONCAT44(in_register_00000034,__fd),(longlong)pvVar1);
  return CONCAT71((int7)((ulong)lVar2 >> 8),
                  lVar2 == (long)(this->frame).buffer.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->frame).buffer.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start && lVar2 != -1);
}

Assistant:

bool FrameWriter::write(QIODevice &socket) const
{
    auto &buffer = frame.buffer;
    Q_ASSERT(buffer.size() >= frameHeaderSize);
    // Do some sanity check first:

    Q_ASSERT(int(frame.type()) < int(FrameType::LAST_FRAME_TYPE));
    Q_ASSERT(frame.validateHeader() == FrameStatus::goodFrame);

    const auto nWritten = socket.write(reinterpret_cast<const char *>(&buffer[0]),
                                       buffer.size());
    return nWritten != -1 && size_type(nWritten) == buffer.size();
}